

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatSkill.cpp
# Opt level: O0

void Handlers::StatSkill_Remove(Character *character,PacketReader *reader)

{
  bool bVar1;
  undefined1 local_50 [8];
  PacketBuilder reply;
  short spell_id;
  PacketReader *reader_local;
  Character *character_local;
  
  PacketReader::GetInt(reader);
  reply.add_size._6_2_ = PacketReader::GetShort(reader);
  if ((character->npc_type == Skills) &&
     (bVar1 = Character::DelSpell(character,reply.add_size._6_2_), bVar1)) {
    PacketBuilder::PacketBuilder((PacketBuilder *)local_50,PACKET_STATSKILL,PACKET_REMOVE,2);
    PacketBuilder::AddShort((PacketBuilder *)local_50,(int)(short)reply.add_size._6_2_);
    Character::Send(character,(PacketBuilder *)local_50);
    PacketBuilder::~PacketBuilder((PacketBuilder *)local_50);
  }
  return;
}

Assistant:

void StatSkill_Remove(Character *character, PacketReader &reader)
{
	/*int shopid = */reader.GetInt();
	short spell_id = reader.GetShort();

	if (character->npc_type == ENF::Skills)
	{
		if (character->DelSpell(spell_id))
		{
			PacketBuilder reply(PACKET_STATSKILL, PACKET_REMOVE, 2);
			reply.AddShort(spell_id);
			character->Send(reply);
		}
	}
}